

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

color_quad_u8 __thiscall
crnlib::dxt1_block::unpack_color(dxt1_block *this,uint16 packed_color,bool scaled,uint alpha)

{
  uint uVar1;
  undefined7 in_register_00000011;
  undefined2 in_register_00000032;
  uint uVar2;
  uint8 uVar3;
  byte bVar4;
  uint uVar5;
  
  uVar2 = packed_color & 0x1f;
  uVar3 = (uint8)((packed_color & 0x7e0) >> 5);
  uVar5 = CONCAT22(in_register_00000032,packed_color) >> 0xb;
  bVar4 = (byte)uVar5;
  if ((int)CONCAT71(in_register_00000011,scaled) != 0) {
    uVar2 = (uVar2 >> 2) + uVar2 * 8;
    uVar3 = (char)((packed_color & 0x7e0) >> 9) + uVar3 * '\x04';
    bVar4 = (byte)((short)uVar5 << 3) | (byte)(packed_color >> 0xd);
  }
  uVar1 = 0xff;
  if (alpha < 0xff) {
    uVar1 = alpha;
  }
  this->m_low_color[0] = bVar4;
  this->m_low_color[1] = uVar3;
  this->m_high_color[0] = (uint8)uVar2;
  this->m_high_color[1] = (uint8)uVar1;
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint alpha)
    {
        uint b = packed_color & 31U;
        uint g = (packed_color >> 5U) & 63U;
        uint r = (packed_color >> 11U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 2U) | (g >> 4U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
    }